

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

void __thiscall kj::Arena::~Arena(Arena *this)

{
  EVP_PKEY_CTX *in_RSI;
  UnwindDetector _kjUnwindDetector48;
  UnwindDetector local_2c;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_arena_c__:48:3)>
  local_28;
  
  UnwindDetector::UnwindDetector(&local_2c);
  local_28.maybeFunc.ptr.isSet = true;
  local_28.maybeFunc.ptr.field_1.value._kjUnwindDetector48 = &local_2c;
  local_28.maybeFunc.ptr.field_1.value.this = this;
  cleanup(this,in_RSI);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena.c++:48:3)>
  ::~Deferred(&local_28);
  return;
}

Assistant:

Arena::~Arena() noexcept(false) {
  // Run cleanup() explicitly, but if it throws an exception, make sure to run it again as part of
  // unwind.  The second call will not throw because destructors are required to guard against
  // exceptions when already unwinding.
  KJ_ON_SCOPE_FAILURE(cleanup());
  cleanup();
}